

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_torrent_params.cpp
# Opt level: O0

void __thiscall
libtorrent::add_torrent_params::add_torrent_params
          (add_torrent_params *this,storage_constructor_type *sc)

{
  storage_constructor_type *sc_local;
  add_torrent_params *this_local;
  
  this->version = 0x27de;
  std::shared_ptr<libtorrent::torrent_info>::shared_ptr(&this->ti);
  libtorrent::aux::
  noexcept_movable<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::noexcept_movable(&this->trackers);
  libtorrent::aux::noexcept_movable<std::vector<int,_std::allocator<int>_>_>::noexcept_movable
            (&this->tracker_tiers);
  libtorrent::aux::
  noexcept_movable<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ::noexcept_movable(&this->dht_nodes);
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->save_path);
  this->storage_mode = storage_mode_sparse;
  libtorrent::aux::
  noexcept_movable<std::function<libtorrent::storage_interface_*(const_libtorrent::storage_params_&,_libtorrent::file_pool_&)>_>
  ::noexcept_movable(&this->storage,sc);
  this->userdata = (void *)0x0;
  libtorrent::aux::
  noexcept_movable<std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  ::noexcept_movable(&this->file_priorities);
  libtorrent::aux::
  noexcept_movable<std::vector<std::function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*)>,_std::allocator<std::function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_void_*)>_>_>_>
  ::noexcept_movable(&this->extensions);
  std::__cxx11::string::string((string *)&this->trackerid);
  (this->flags).m_val = 0x560b8;
  digest32<160L>::digest32(&this->info_hash);
  this->max_uploads = -1;
  this->max_connections = -1;
  this->upload_limit = -1;
  this->download_limit = -1;
  this->total_uploaded = 0;
  this->total_downloaded = 0;
  this->active_time = 0;
  this->finished_time = 0;
  this->seeding_time = 0;
  this->added_time = 0;
  this->completed_time = 0;
  this->last_seen_complete = 0;
  this->num_complete = -1;
  this->num_incomplete = -1;
  this->num_downloaded = -1;
  libtorrent::aux::
  noexcept_movable<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::noexcept_movable(&this->http_seeds);
  libtorrent::aux::
  noexcept_movable<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::noexcept_movable(&this->url_seeds);
  libtorrent::aux::
  noexcept_movable<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  ::noexcept_movable(&this->peers);
  libtorrent::aux::
  noexcept_movable<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
  ::noexcept_movable(&this->banned_peers);
  libtorrent::aux::
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>_>
  ::noexcept_movable(&this->unfinished_pieces);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->have_pieces);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  typed_bitfield(&this->verified_pieces);
  libtorrent::aux::
  noexcept_movable<std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  ::noexcept_movable(&this->piece_priorities);
  libtorrent::aux::
  noexcept_movable<std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
  ::noexcept_movable(&this->merkle_tree);
  libtorrent::aux::
  noexcept_movable<std::map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::noexcept_movable(&this->renamed_files);
  this->last_download = 0;
  this->last_upload = 0;
  std::__cxx11::string::string((string *)&this->url);
  std::__cxx11::string::string((string *)&this->uuid);
  libtorrent::aux::noexcept_movable<std::vector<char,_std::allocator<char>_>_>::noexcept_movable
            (&this->resume_data);
  boost::system::error_code::error_code(&this->internal_resume_data_error);
  return;
}

Assistant:

add_torrent_params::add_torrent_params(storage_constructor_type sc)
		: storage(std::move(sc)) {}